

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_suite.cpp
# Opt level: O1

void __thiscall parser_suite::test_scheme::test_method(test_scheme *this)

{
  int iVar1;
  long *local_220 [2];
  long local_210 [2];
  char *local_200;
  string *local_1f8;
  undefined **local_1f0;
  undefined1 local_1e8;
  undefined8 *local_1e0;
  char *local_1d8;
  view_type local_1d0;
  undefined8 *local_1c0;
  string **local_1b8;
  undefined **local_1b0;
  undefined1 local_1a8;
  undefined8 *local_1a0;
  char **local_198;
  undefined1 local_190 [8];
  undefined8 local_188;
  shared_count sStack_180;
  char *local_178;
  char *local_170;
  char input [10];
  parser parser;
  char *local_c0;
  char *local_b8;
  undefined1 *local_b0;
  undefined1 *local_a8;
  char *local_a0;
  char *local_98;
  undefined1 *local_90;
  undefined1 *local_88;
  char *local_80;
  char *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  local_1d0.ptr_ = input;
  builtin_strncpy(input,"scheme://",10);
  local_1d0.len_ = strlen(local_1d0.ptr_);
  parser.current_scheme.ptr_ = (char *)0x0;
  parser.current_scheme.len_ = 0;
  parser.current_authority.ptr_ = (char *)0x0;
  parser.current_authority.len_ = 0;
  parser.current_userinfo.ptr_ = (char *)0x0;
  parser.current_userinfo.len_ = 0;
  parser.current_host.ptr_ = (char *)0x0;
  parser.current_host.len_ = 0;
  parser.current_port.ptr_ = (char *)0x0;
  parser.current_port.len_ = 0;
  parser.current_path.ptr_ = (char *)0x0;
  parser.current_path.len_ = 0;
  parser.current_query.ptr_ = (char *)0x0;
  parser.current_query.len_ = 0;
  parser.current_fragment.ptr_ = (char *)0x0;
  parser.current_fragment.len_ = 0;
  trial::url::basic_parser<char>::parse(&parser,&local_1d0);
  local_40 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/parser_suite.cpp";
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x22);
  local_1e8 = 0;
  local_1f0 = &PTR__lazy_ostream_00186260;
  local_1e0 = &boost::unit_test::lazy_ostream::inst;
  local_1d8 = "";
  local_220[0] = local_210;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_220,parser.current_scheme.ptr_,
             parser.current_scheme.ptr_ + parser.current_scheme.len_);
  iVar1 = std::__cxx11::string::compare((char *)local_220);
  local_190[0] = iVar1 == 0;
  local_188 = 0;
  sStack_180.pi_ = (sp_counted_base *)0x0;
  local_178 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/parser_suite.cpp";
  local_170 = "";
  local_1b8 = &local_1f8;
  local_1d0.len_ = local_1d0.len_ & 0xffffffffffffff00;
  local_1d0.ptr_ = (char *)&PTR__lazy_ostream_001862d8;
  local_1c0 = &boost::unit_test::lazy_ostream::inst;
  local_198 = &local_200;
  local_200 = "scheme";
  local_1a8 = 0;
  local_1b0 = &PTR__lazy_ostream_00186358;
  local_1a0 = &boost::unit_test::lazy_ostream::inst;
  local_1f8 = (string *)local_220;
  boost::test_tools::tt_detail::report_assertion
            (local_190,&local_1f0,&local_178,0x22,2,2,2,"parser.scheme()",&local_1d0,"\"scheme\"",
             &local_1b0);
  boost::detail::shared_count::~shared_count(&sStack_180);
  if (local_220[0] != local_210) {
    operator_delete(local_220[0],local_210[0] + 1);
  }
  local_60 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/parser_suite.cpp";
  local_58 = "";
  local_70 = &boost::unit_test::basic_cstring<char_const>::null;
  local_68 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_60,0x23);
  local_1e8 = 0;
  local_1f0 = &PTR__lazy_ostream_00186260;
  local_1e0 = &boost::unit_test::lazy_ostream::inst;
  local_1d8 = "";
  local_220[0] = local_210;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_220,parser.current_authority.ptr_,
             parser.current_authority.ptr_ + parser.current_authority.len_);
  iVar1 = std::__cxx11::string::compare((char *)local_220);
  local_190[0] = iVar1 == 0;
  local_188 = 0;
  sStack_180.pi_ = (sp_counted_base *)0x0;
  local_178 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/parser_suite.cpp";
  local_170 = "";
  local_1d0.len_ = local_1d0.len_ & 0xffffffffffffff00;
  local_1d0.ptr_ = (char *)&PTR__lazy_ostream_001862d8;
  local_1c0 = &boost::unit_test::lazy_ostream::inst;
  local_1b8 = &local_1f8;
  local_200 = "";
  local_1a8 = 0;
  local_1b0 = &PTR__lazy_ostream_00186318;
  local_1a0 = &boost::unit_test::lazy_ostream::inst;
  local_198 = &local_200;
  local_1f8 = (string *)local_220;
  boost::test_tools::tt_detail::report_assertion
            (local_190,&local_1f0,&local_178,0x23,2,2,2,"parser.authority()",&local_1d0,"\"\"",
             &local_1b0);
  boost::detail::shared_count::~shared_count(&sStack_180);
  if (local_220[0] != local_210) {
    operator_delete(local_220[0],local_210[0] + 1);
  }
  local_80 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/parser_suite.cpp";
  local_78 = "";
  local_90 = &boost::unit_test::basic_cstring<char_const>::null;
  local_88 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_80,0x24);
  local_1e8 = 0;
  local_1f0 = &PTR__lazy_ostream_00186260;
  local_1e0 = &boost::unit_test::lazy_ostream::inst;
  local_1d8 = "";
  local_220[0] = local_210;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_220,parser.current_path.ptr_,
             parser.current_path.ptr_ + parser.current_path.len_);
  iVar1 = std::__cxx11::string::compare((char *)local_220);
  local_190[0] = iVar1 == 0;
  local_188 = 0;
  sStack_180.pi_ = (sp_counted_base *)0x0;
  local_178 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/parser_suite.cpp";
  local_170 = "";
  local_1d0.len_ = local_1d0.len_ & 0xffffffffffffff00;
  local_1d0.ptr_ = (char *)&PTR__lazy_ostream_001862d8;
  local_1c0 = &boost::unit_test::lazy_ostream::inst;
  local_1b8 = &local_1f8;
  local_200 = "";
  local_1a8 = 0;
  local_1b0 = &PTR__lazy_ostream_00186318;
  local_1a0 = &boost::unit_test::lazy_ostream::inst;
  local_198 = &local_200;
  local_1f8 = (string *)local_220;
  boost::test_tools::tt_detail::report_assertion
            (local_190,&local_1f0,&local_178,0x24,2,2,2,"parser.path()",&local_1d0,"\"\"",&local_1b0
            );
  boost::detail::shared_count::~shared_count(&sStack_180);
  if (local_220[0] != local_210) {
    operator_delete(local_220[0],local_210[0] + 1);
  }
  local_a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/parser_suite.cpp";
  local_98 = "";
  local_b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_a0,0x25);
  local_1e8 = 0;
  local_1f0 = &PTR__lazy_ostream_00186260;
  local_1e0 = &boost::unit_test::lazy_ostream::inst;
  local_1d8 = "";
  local_220[0] = local_210;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_220,parser.current_query.ptr_,
             parser.current_query.ptr_ + parser.current_query.len_);
  iVar1 = std::__cxx11::string::compare((char *)local_220);
  local_190[0] = iVar1 == 0;
  local_188 = 0;
  sStack_180.pi_ = (sp_counted_base *)0x0;
  local_178 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/parser_suite.cpp";
  local_170 = "";
  local_1d0.len_ = local_1d0.len_ & 0xffffffffffffff00;
  local_1d0.ptr_ = (char *)&PTR__lazy_ostream_001862d8;
  local_1c0 = &boost::unit_test::lazy_ostream::inst;
  local_1b8 = &local_1f8;
  local_200 = "";
  local_1a8 = 0;
  local_1b0 = &PTR__lazy_ostream_00186318;
  local_1a0 = &boost::unit_test::lazy_ostream::inst;
  local_198 = &local_200;
  local_1f8 = (string *)local_220;
  boost::test_tools::tt_detail::report_assertion
            (local_190,&local_1f0,&local_178,0x25,2,2,2,"parser.query()",&local_1d0,"\"\"",
             &local_1b0);
  boost::detail::shared_count::~shared_count(&sStack_180);
  if (local_220[0] != local_210) {
    operator_delete(local_220[0],local_210[0] + 1);
  }
  local_c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/parser_suite.cpp";
  local_b8 = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_c0,0x26);
  local_1e8 = 0;
  local_1f0 = &PTR__lazy_ostream_00186260;
  local_1e0 = &boost::unit_test::lazy_ostream::inst;
  local_1d8 = "";
  local_220[0] = local_210;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_220,parser.current_fragment.ptr_,
             parser.current_fragment.ptr_ + parser.current_fragment.len_);
  iVar1 = std::__cxx11::string::compare((char *)local_220);
  local_190[0] = iVar1 == 0;
  local_188 = 0;
  sStack_180.pi_ = (sp_counted_base *)0x0;
  local_178 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/parser_suite.cpp";
  local_170 = "";
  local_1d0.len_ = local_1d0.len_ & 0xffffffffffffff00;
  local_1d0.ptr_ = (char *)&PTR__lazy_ostream_001862d8;
  local_1c0 = &boost::unit_test::lazy_ostream::inst;
  local_1b8 = &local_1f8;
  local_200 = "";
  local_1a8 = 0;
  local_1b0 = &PTR__lazy_ostream_00186318;
  local_1a0 = &boost::unit_test::lazy_ostream::inst;
  local_198 = &local_200;
  local_1f8 = (string *)local_220;
  boost::test_tools::tt_detail::report_assertion
            (local_190,&local_1f0,&local_178,0x26,2,2,2,"parser.fragment()",&local_1d0,"\"\"",
             &local_1b0);
  boost::detail::shared_count::~shared_count(&sStack_180);
  if (local_220[0] != local_210) {
    operator_delete(local_220[0],local_210[0] + 1);
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(test_scheme)
{
    const char input[] = "scheme://";
    url::parser parser(input);
    BOOST_REQUIRE_EQUAL(parser.scheme(), "scheme");
    BOOST_REQUIRE_EQUAL(parser.authority(), "");
    BOOST_REQUIRE_EQUAL(parser.path(), "");
    BOOST_REQUIRE_EQUAL(parser.query(), "");
    BOOST_REQUIRE_EQUAL(parser.fragment(), "");
}